

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
RemoveAllocator(HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                *this,TBlockAllocatorType *allocator)

{
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  *pSVar1;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if (&this->allocatorHead == allocator) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x136,"(allocator != &this->allocatorHead)",
                       "allocator != &this->allocatorHead");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
  Clear(allocator);
  pSVar1 = allocator->prev;
  pSVar2 = allocator->next;
  pSVar2->prev = pSVar1;
  pSVar1->next = pSVar2;
  if (this->lastExplicitFreeListAllocator == allocator) {
    this->lastExplicitFreeListAllocator = &this->allocatorHead;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::RemoveAllocator(TBlockAllocatorType * allocator)
{
    Assert(allocator != &this->allocatorHead);
    ClearAllocator(allocator);

    allocator->next->prev = allocator->prev;
    allocator->prev->next = allocator->next;

    if (allocator == this->lastExplicitFreeListAllocator)
    {
        this->lastExplicitFreeListAllocator = &allocatorHead;
    }
}